

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array.cpp
# Opt level: O2

bool __thiscall ON_UuidPairList::RemovePair(ON_UuidPairList *this,ON_UUID id1)

{
  ON_UuidPair *pOVar1;
  uint uVar2;
  ON_UUID local_18;
  
  local_18.Data4 = id1.Data4;
  local_18._0_8_ = id1._0_8_;
  pOVar1 = SearchHelper(this,&local_18);
  if (pOVar1 != (ON_UuidPair *)0x0) {
    pOVar1->m_uuid[0].Data1 = 0xffffffff;
    pOVar1->m_uuid[0].Data2 = 0xffff;
    pOVar1->m_uuid[0].Data3 = 0xffff;
    pOVar1->m_uuid[0].Data4[0] = 0xff;
    pOVar1->m_uuid[0].Data4[1] = 0xff;
    pOVar1->m_uuid[0].Data4[2] = 0xff;
    pOVar1->m_uuid[0].Data4[3] = 0xff;
    pOVar1->m_uuid[0].Data4[4] = 0xff;
    pOVar1->m_uuid[0].Data4[5] = 0xff;
    pOVar1->m_uuid[0].Data4[6] = 0xff;
    pOVar1->m_uuid[0].Data4[7] = 0xff;
    pOVar1->m_uuid[1].Data1 = 0xffffffff;
    pOVar1->m_uuid[1].Data2 = 0xffff;
    pOVar1->m_uuid[1].Data3 = 0xffff;
    pOVar1->m_uuid[1].Data4[0] = 0xff;
    pOVar1->m_uuid[1].Data4[1] = 0xff;
    pOVar1->m_uuid[1].Data4[2] = 0xff;
    pOVar1->m_uuid[1].Data4[3] = 0xff;
    pOVar1->m_uuid[1].Data4[4] = 0xff;
    pOVar1->m_uuid[1].Data4[5] = 0xff;
    pOVar1->m_uuid[1].Data4[6] = 0xff;
    pOVar1->m_uuid[1].Data4[7] = 0xff;
    this->m_removed_count = this->m_removed_count + 1;
    uVar2 = (uint)((ulong)((long)pOVar1 - (long)(this->super_ON_SimpleArray<ON_UuidPair>).m_a) >> 5)
    ;
    if (uVar2 < this->m_sorted_count) {
      this->m_sorted_count = uVar2;
    }
  }
  return pOVar1 != (ON_UuidPair *)0x0;
}

Assistant:

bool ON_UuidPairList::RemovePair(ON_UUID id1)
{
  ON_UuidPair* p = SearchHelper(&id1);
  if ( 0 != p )
  {
    p->m_uuid[0] = ON_max_uuid;
    p->m_uuid[1] = ON_max_uuid;
    m_removed_count++;
    unsigned int i = (unsigned int)(p - m_a);
    if ( i < m_sorted_count )
      m_sorted_count = i;
  }
  return (0!=p);
}